

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_default_catalog.cpp
# Opt level: O2

void ConcurrentDefaultCatalog::QueryDefaultCatalogFunctions
               (DuckDB *db,bool *read_correct,int thread_id)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_31e;
  allocator local_31d;
  allocator local_31c;
  allocator local_31b;
  allocator local_31a;
  allocator local_319;
  allocator local_318;
  allocator local_317;
  allocator local_316;
  allocator local_315;
  allocator local_314;
  allocator local_313;
  allocator local_312;
  allocator local_311;
  allocator local_310;
  allocator local_30f;
  allocator local_30e;
  allocator local_30d;
  allocator local_30c;
  allocator local_30b;
  allocator local_30a;
  allocator local_309;
  long *local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  random_queries;
  Connection con;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string
            ((string *)&con,"SELECT pg_collation_is_visible(0)",(allocator *)&local_308);
  std::__cxx11::string::string(local_2c8,"SELECT pg_conversion_is_visible(0)",&local_309);
  std::__cxx11::string::string(local_2a8,"SELECT pg_function_is_visible(0)",&local_30a);
  std::__cxx11::string::string(local_288,"SELECT pg_opclass_is_visible(0)",&local_30b);
  std::__cxx11::string::string(local_268,"SELECT pg_operator_is_visible(0)",&local_30c);
  std::__cxx11::string::string(local_248,"SELECT pg_opfamily_is_visible(0)",&local_30d);
  std::__cxx11::string::string(local_228,"SELECT pg_table_is_visible(0)",&local_30e);
  std::__cxx11::string::string(local_208,"SELECT pg_ts_config_is_visible(0)",&local_30f);
  std::__cxx11::string::string(local_1e8,"SELECT pg_ts_dict_is_visible(0)",&local_310);
  std::__cxx11::string::string(local_1c8,"SELECT pg_ts_parser_is_visible(0)",&local_311);
  std::__cxx11::string::string(local_1a8,"SELECT pg_ts_template_is_visible(0)",&local_312);
  std::__cxx11::string::string(local_188,"SELECT pg_type_is_visible(0)",&local_313);
  std::__cxx11::string::string(local_168,"SELECT current_user",&local_314);
  std::__cxx11::string::string(local_148,"SELECT current_catalog",&local_315);
  std::__cxx11::string::string(local_128,"SELECT current_database()",&local_316);
  std::__cxx11::string::string(local_108,"SELECT user",&local_317);
  std::__cxx11::string::string(local_e8,"SELECT session_user",&local_318);
  std::__cxx11::string::string(local_c8,"SELECT inet_client_addr()",&local_319);
  std::__cxx11::string::string(local_a8,"SELECT inet_client_port()",&local_31a);
  std::__cxx11::string::string(local_88,"SELECT inet_server_addr()",&local_31b);
  std::__cxx11::string::string(local_68,"SELECT inet_server_port()",&local_31c);
  std::__cxx11::string::string(local_48,"SELECT pg_my_temp_schema()",&local_31d);
  __l._M_len = 0x16;
  __l._M_array = (iterator)&con;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&random_queries.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,__l,&local_31e);
  lVar3 = 0x2a0;
  do {
    std::__cxx11::string::~string((string *)(&con + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  duckdb::Connection::Connection(&con,db);
  *read_correct = true;
  lVar3 = 10;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    iVar2 = rand();
    duckdb::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    get<true>(&random_queries,
              (ulong)(long)iVar2 %
              (ulong)((long)random_queries.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)random_queries.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5));
    duckdb::Connection::Query((string *)&local_308);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_308);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      *read_correct = false;
    }
    if (local_308 != (long *)0x0) {
      (**(code **)(*local_308 + 8))();
    }
  }
  duckdb::Connection::~Connection(&con);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&random_queries);
  return;
}

Assistant:

static void QueryDefaultCatalogFunctions(DuckDB *db, bool *read_correct, int thread_id) {
		duckdb::vector<string> random_queries {
		    "SELECT pg_collation_is_visible(0)",
		    "SELECT pg_conversion_is_visible(0)",
		    "SELECT pg_function_is_visible(0)",
		    "SELECT pg_opclass_is_visible(0)",
		    "SELECT pg_operator_is_visible(0)",
		    "SELECT pg_opfamily_is_visible(0)",
		    "SELECT pg_table_is_visible(0)",
		    "SELECT pg_ts_config_is_visible(0)",
		    "SELECT pg_ts_dict_is_visible(0)",
		    "SELECT pg_ts_parser_is_visible(0)",
		    "SELECT pg_ts_template_is_visible(0)",
		    "SELECT pg_type_is_visible(0)",
		    "SELECT current_user",
		    "SELECT current_catalog",
		    "SELECT current_database()",
		    "SELECT user",
		    "SELECT session_user",
		    "SELECT inet_client_addr()",
		    "SELECT inet_client_port()",
		    "SELECT inet_server_addr()",
		    "SELECT inet_server_port()",
		    "SELECT pg_my_temp_schema()",
		};

		Connection con(*db);
		*read_correct = true;
		for (idx_t i = 0; i < CONCURRENT_DEFAULT_ITERATION_COUNT; i++) {
			auto result = con.Query(random_queries[rand() % random_queries.size()]);
			if (result->HasError()) {
				*read_correct = false;
			}
		}
	}